

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O0

void __thiscall CTPNStmTryBase::add_catch(CTPNStmTryBase *this,CTPNStmCatch *catch_stm)

{
  CTPNStmCatchBase *in_RSI;
  long in_RDI;
  
  if (*(long *)(in_RDI + 0x38) == 0) {
    *(CTPNStmCatchBase **)(in_RDI + 0x30) = in_RSI;
  }
  else {
    CTPNStmCatchBase::set_next_catch(*(CTPNStmCatchBase **)(in_RDI + 0x38),(CTPNStmCatch *)in_RSI);
  }
  *(CTPNStmCatchBase **)(in_RDI + 0x38) = in_RSI;
  CTPNStmCatchBase::set_next_catch(in_RSI,(CTPNStmCatch *)0x0);
  CTPNStmBase::set_next_stm((CTPNStmBase *)in_RSI,(CTPNStm *)0x0);
  return;
}

Assistant:

void CTPNStmTryBase::add_catch(CTPNStmCatch *catch_stm)
{
    /* link it in at the end of our list */
    if (last_catch_stm_ != 0)
        last_catch_stm_->set_next_catch(catch_stm);
    else
        first_catch_stm_ = catch_stm;

    /* it's now the last catch statement */
    last_catch_stm_ = catch_stm;
    catch_stm->set_next_catch(0);

    /* it's the last statement in its group */
    catch_stm->set_next_stm(0);
}